

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<char,duckdb_fmt::v6::basic_format_specs<char>>::num_writer>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>_> *this,int num_digits,string_view prefix
          ,format_specs specs,num_writer f)

{
  int in_ESI;
  int in_stack_00000008;
  int in_stack_0000000c;
  byte in_stack_00000011;
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_>::num_writer>
  *in_stack_00000028;
  undefined1 in_stack_00000030;
  type unsiged_width;
  size_t padding;
  char_type fill;
  size_t size;
  undefined7 in_stack_ffffffffffffffb9;
  undefined4 in_stack_ffffffffffffffc0;
  type in_stack_ffffffffffffffc4;
  basic_string_view<char> local_10;
  
  basic_string_view<char>::size(&local_10);
  to_unsigned<int>(in_ESI);
  fill_t<char>::operator[]((fill_t<char> *)&stack0x00000012,0);
  if ((in_stack_00000011 & 0xf) == 4) {
    in_stack_ffffffffffffffc4 = to_unsigned<int>(in_stack_00000008);
  }
  else if (in_ESI < in_stack_0000000c) {
    basic_string_view<char>::size(&local_10);
    to_unsigned<int>(in_stack_0000000c);
    to_unsigned<int>(in_stack_0000000c - in_ESI);
  }
  write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<char,duckdb_fmt::v6::basic_format_specs<char>>::num_writer>>
            ((basic_writer<duckdb_fmt::v6::buffer_range<char>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (format_specs *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_00000030),in_stack_00000028
            );
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }